

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_wstring.cpp
# Opt level: O3

bool IsCommaDelimitedDoubleArray(wchar_t *wsz,int length,int numDoubles)

{
  bool bVar1;
  ulong uVar2;
  ulong uVar3;
  wchar_t wVar4;
  ON_Internal_Empty_wString *pOVar5;
  int iVar6;
  ulong uVar7;
  ON_wString OVar8;
  bool bVar9;
  wchar_t *pwVar10;
  ON_wString s;
  wchar_t buf [401];
  ON_wString local_680;
  wchar_t local_678 [404];
  
  if (length == 0) {
    bVar9 = false;
  }
  else {
    ON_wString::ON_wString(&local_680,wsz);
    ON_wString::AppendToArray(&local_680,1,L",");
    memset(local_678,0,0x644);
    ON_wString::CopyArray(&local_680);
    if (numDoubles < 1) {
      bVar9 = true;
    }
    else {
      pOVar5 = &empty_wstring;
      if (local_680.m_s != (wchar_t *)0x0) {
        pOVar5 = (ON_Internal_Empty_wString *)(local_680.m_s + -3);
      }
      pwVar10 = (wchar_t *)0x0;
      OVar8.m_s = local_680.m_s;
      if ((pOVar5->header).string_capacity < 1) {
        OVar8.m_s = pwVar10;
      }
      iVar6 = 0;
      do {
        bVar9 = SUB81(pwVar10,0);
        wVar4 = *OVar8.m_s;
        if (wVar4 == L',') {
          local_678[0] = L'\0';
          uVar7 = 0;
        }
        else {
          if (wVar4 == L'\0') break;
          uVar3 = 0;
          do {
            uVar2 = uVar3;
            *(wchar_t *)((long)local_678 + uVar2) = wVar4;
            wVar4 = *(OVar8.m_s + uVar2 + 4);
            uVar3 = uVar2 + 4;
            if (wVar4 == L',') break;
          } while (uVar3 < 0x640);
          uVar7 = (long)uVar3 >> 2;
          *(undefined4 *)((long)local_678 + uVar2 + 4) = 0;
          if (399 < uVar7) break;
          OVar8.m_s = OVar8.m_s + uVar3;
        }
        bVar1 = IsValidRealNumber(local_678,(int)uVar7);
        if (!bVar1) break;
        iVar6 = iVar6 + 1;
        OVar8.m_s = OVar8.m_s + 1;
        bVar9 = numDoubles <= iVar6;
        pwVar10 = (wchar_t *)(ulong)bVar9;
      } while (iVar6 != numDoubles);
    }
    ON_wString::~ON_wString(&local_680);
  }
  return bVar9;
}

Assistant:

static bool IsCommaDelimitedDoubleArray(const wchar_t* wsz, int length, int numDoubles)
{
  if (length == 0)
   return false;

  if ((numDoubles < 1) || (numDoubles > 16))
    return false;

  if (1 == numDoubles) // Optimization.
    return ::IsValidRealNumber(wsz, length);

  // Make sure the input buffer ends with a comma; simplifies the following loop.
  ON_wString s(wsz);
  s += L",";

  // Temporary buffer for isolating each 'double' string element.
  constexpr size_t maxChars = 400;
  wchar_t buf[maxChars+1] = { 0 };

  // Use 'p' to scan the input buffer.
  const auto* p = s.Array();

  for (int i = 0; i < numDoubles; i++)
  {
    // 4th January 2024 John Croudy, https://mcneel.myjetbrains.com/youtrack/issue/RH-79458
    // If we've reached the end of the input buffer, we've run out of string elements early; fail.
    if (0 == *p)
      return false;

    // Copy the next comma-delimited element to buf. (q - buf) is the length copied so far.
    wchar_t* q = buf;
    while ((*p != L',') && ((q - buf) < maxChars))
      *q++ = *p++;
    *q = 0;
    p++;

    const auto len = q - buf;
    if (len >= maxChars)
      return false;

    // Check that the element in the buffer is a valid real number (double).
    if (!::IsValidRealNumber(buf, int(len)))
      return false;
  }

  return true;
}